

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

mat3x2f * __thiscall Triangle::jacobi(mat3x2f *__return_storage_ptr__,Triangle *this)

{
  float fVar1;
  float fVar2;
  vec3f vVar3;
  vec3f vVar4;
  mat2f a;
  data_t local_58;
  data_t dStack_54;
  mat2f local_48;
  mat3x2f local_38;
  
  vVar3 = operator-(&this->v2,&this->v1);
  vVar4 = operator-(&this->v3,&this->v1);
  local_38.data[2][1] = vVar4.z;
  local_38.data[0][1] = vVar4.x;
  local_38.data[1][1] = vVar4.y;
  local_58 = vVar3.x;
  dStack_54 = vVar3.y;
  local_38.data[0][0] = local_58;
  local_38.data[1][0] = dStack_54;
  fVar1 = (this->vt1).x;
  fVar2 = (this->vt1).y;
  a.data[0][0] = (this->vt2).x - fVar1;
  a.data[0][1] = (this->vt3).x - fVar1;
  a.data[1][0] = (this->vt2).y - fVar2;
  a.data[1][1] = (this->vt3).y - fVar2;
  local_38.data[2][0] = vVar3.z;
  local_48 = inverse(a);
  operator*(__return_storage_ptr__,&local_38,&local_48);
  return __return_storage_ptr__;
}

Assistant:

mat3x2f jacobi() const // [dpdu dpdv]
	{
		return mat3x2f(v2-v1, v3-v1) * inverse(mat2f(vt2-vt1, vt3-vt1));
	}